

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

int64_t Imf_3_3::istream_nonparallel_read
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  long *plVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  exception *e;
  int64_t nread;
  lock_guard<std::mutex> lk;
  IStream *s;
  istream_holder *ih;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  long local_58;
  long local_8;
  
  plVar1 = *(long **)(in_RSI + 0x28);
  if (0x7fffffff < in_RCX) {
    (*in_R9)(in_RDI,10,"Stream interface request to read block too large");
    return -1;
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_58 = (**(code **)(*plVar1 + 0x28))();
  if (in_R8 != local_58) {
    (**(code **)(*plVar1 + 0x30))(plVar1,in_R8);
    local_58 = (**(code **)(*plVar1 + 0x28))();
    if (in_R8 != local_58) {
      (*in_R9)(in_RDI,10,"Unable to seek to desired offset %lu",in_R8);
      local_8 = -1;
      goto LAB_009516fe;
    }
  }
  (**(code **)(*plVar1 + 0x18))(plVar1,in_RDX,in_RCX & 0xffffffff);
  local_8 = (**(code **)(*plVar1 + 0x28))();
  local_8 = local_8 - local_58;
LAB_009516fe:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x951708);
  return local_8;
}

Assistant:

static int64_t
istream_nonparallel_read (
    exr_const_context_t         ctxt,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    istream_holder* ih = static_cast<istream_holder*> (userdata);
    IStream*        s  = ih->_stream;

    if (sz > INT_MAX)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Stream interface request to read block too large");
        return -1;
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lk{ih->_mx};
#endif

    int64_t         nread = s->tellg ();
    try
    {
        if (offset != static_cast<size_t> (nread))
        {
            s->seekg (offset);
            nread = s->tellg ();
            if (offset != static_cast<size_t> (nread))
            {
                error_cb (
                    ctxt,
                    EXR_ERR_READ_IO,
                    "Unable to seek to desired offset %" PRIu64,
                    offset);
                return -1;
            }
        }

        try
        {
            s->read (static_cast<char*> (buffer), static_cast<int> (sz));
        }
        catch (...)
        {
            // bah, there could be two reasons for this, one is a
            // legitimate error, the other is a read past the end of file
            // (i.e. the core library tries to read a 4k block when
            // parsing the header), let's let the core deal with that and
            // clear errors
            ih->_stream->clear ();
            //error_cb (
            //    ctxt,
            //    EXR_ERR_READ_IO,
            //    "Unable to read requested bytes: %" PRIu64,
            //    sz);
        }
        nread = s->tellg () - nread;
    }
    catch (std::exception &e)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": %s",
            offset,
            e.what());
        nread = -1;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": Unknown error",
            offset);
        nread = -1;
    }
    return nread;
}